

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O1

void __thiscall
Js::
CopyRemovePolicy<JsUtil::List<long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
::RemoveAt(CopyRemovePolicy<JsUtil::List<long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
           *this,List<long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *list,int index)

{
  int iVar1;
  Type plVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  Type plVar6;
  
  if ((index < 0) ||
     ((list->super_ReadOnlyList<long,_Memory::HeapAllocator,_DefaultComparer>).count <= index)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/List.h"
                                ,0x2ee,"(index >= 0 && index < list->count)",
                                "index >= 0 && index < list->count");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  iVar1 = (list->super_ReadOnlyList<long,_Memory::HeapAllocator,_DefaultComparer>).count;
  if (index + 1 < iVar1) {
    plVar2 = (list->super_ReadOnlyList<long,_Memory::HeapAllocator,_DefaultComparer>).buffer;
    plVar6 = plVar2 + (index + 1);
    do {
      plVar2[index] = *plVar6;
      index = index + 1;
      plVar6 = plVar6 + 1;
    } while (iVar1 + -1 != index);
  }
  (list->super_ReadOnlyList<long,_Memory::HeapAllocator,_DefaultComparer>).count = iVar1 + -1;
  (list->super_ReadOnlyList<long,_Memory::HeapAllocator,_DefaultComparer>).buffer[iVar1 + -1] = 0;
  return;
}

Assistant:

void RemoveAt(TListType* list, int index)
        {
            Assert(index >= 0 && index < list->count);
            for (int j = index + 1; j < list->count; index++, j++)
            {
                list->buffer[index] = list->buffer[j];
            }
            list->count--;

            if (clearOldEntries)
            {
                ClearArray(list->buffer + list->count, 1);
            }
        }